

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGlaOld.c
# Opt level: O2

Vec_Int_t * Gla_ManRefinement2(Gla_Man_t *p)

{
  undefined4 uVar1;
  Gia_Man_t *pGVar2;
  ulong uVar3;
  uint *puVar4;
  ulong uVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  Vec_Int_t *vCos;
  Vec_Int_t *vPis;
  Vec_Int_t *vPPis;
  Vec_Int_t *vRoAnds;
  Rfn_Obj_t *pRVar9;
  Gia_Obj_t *pGVar10;
  Vec_Int_t *pObj;
  Rfn_Obj_t *pRVar11;
  Rfn_Obj_t *pRVar12;
  Vec_Int_t *pVVar13;
  Abc_Cex_t *pAVar14;
  Rfn_Obj_t RVar15;
  Rfn_Obj_t RVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  Rfn_Obj_t RVar20;
  Gla_Man_t *pGVar21;
  
  Gla_ManRefinement2::Sign = Gla_ManRefinement2::Sign + 1;
  vCos = Vec_IntAlloc(1000);
  vPis = Vec_IntAlloc(1000);
  vPPis = Vec_IntAlloc(1000);
  vRoAnds = Vec_IntAlloc(1000);
  pVVar13 = vPis;
  Gla_ManCollect(p,vPis,vPPis,vCos,vRoAnds);
  for (iVar19 = 0; iVar19 <= p->pPars->iFrame; iVar19 = iVar19 + 1) {
    pVVar13 = (Vec_Int_t *)p->pGia->pObjs;
    pRVar9 = Gla_ObjRef(p,(Gia_Obj_t *)pVVar13,iVar19);
    *pRVar9 = (Rfn_Obj_t)((Gla_ManRefinement2::Sign & 0xfffU) << 0x13);
    iVar18 = vPis->nSize;
    iVar17 = 0;
    if (iVar18 < 1) {
      iVar18 = 0;
      iVar17 = 0;
    }
    while (iVar18 != iVar17) {
      pGVar2 = p->pGia;
      uVar6 = Vec_IntEntry(vPis,iVar17);
      pVVar13 = (Vec_Int_t *)(ulong)uVar6;
      pGVar10 = Gia_ManObj(pGVar2,uVar6);
      if (pGVar10 == (Gia_Obj_t *)0x0) break;
      pRVar9 = Gla_ObjRef(p,pGVar10,iVar19);
      *pRVar9 = (Rfn_Obj_t)0x0;
      iVar7 = Gia_ObjId(p->pGia,pGVar10);
      uVar6 = Gla_ObjSatValue(p,iVar7,iVar19);
      RVar16 = *pRVar9;
      RVar20 = (Rfn_Obj_t)
               ((Gla_ManRefinement2::Sign & 0xfffU) << 0x13 | uVar6 | (uint)RVar16 & 0x80000006);
      pVVar13 = (Vec_Int_t *)(ulong)(uint)RVar20;
      *pRVar9 = RVar20;
      iVar17 = iVar17 + 1;
      if (((uint)RVar16 & 2) != 0) {
        __assert_fail("pRef->fVisit == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absGlaOld.c"
                      ,0x24b,"Vec_Int_t *Gla_ManRefinement2(Gla_Man_t *)");
      }
    }
    iVar18 = vPPis->nSize;
    iVar17 = 0;
    if (iVar18 < 1) {
      iVar18 = 0;
    }
    uVar6 = 8;
    while (iVar18 != iVar17) {
      pGVar2 = p->pGia;
      uVar8 = Vec_IntEntry(vPPis,iVar17);
      pVVar13 = (Vec_Int_t *)(ulong)uVar8;
      pGVar10 = Gia_ManObj(pGVar2,uVar8);
      if (pGVar10 == (Gia_Obj_t *)0x0) break;
      if ((int)*(uint *)pGVar10 < 0 || (~*(uint *)pGVar10 & 0x1fffffff) == 0) {
        iVar7 = Gia_ObjIsRo(p->pGia,pGVar10);
        if (iVar7 == 0) {
          __assert_fail("Gia_ObjIsAnd(pObj) || Gia_ObjIsRo(p->pGia, pObj)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absGlaOld.c"
                        ,0x251,"Vec_Int_t *Gla_ManRefinement2(Gla_Man_t *)");
        }
      }
      pRVar9 = Gla_ObjRef(p,pGVar10,iVar19);
      *pRVar9 = (Rfn_Obj_t)0x0;
      iVar7 = Gia_ObjId(p->pGia,pGVar10);
      uVar8 = Gla_ObjSatValue(p,iVar7,iVar19);
      RVar16 = *pRVar9;
      iVar17 = iVar17 + 1;
      uVar8 = uVar6 & 0x7fff8 | uVar8;
      pVVar13 = (Vec_Int_t *)(ulong)uVar8;
      *pRVar9 = (Rfn_Obj_t)
                ((Gla_ManRefinement2::Sign & 0xfffU) << 0x13 | uVar8 | (uint)RVar16 & 0x80000002 | 4
                );
      uVar6 = uVar6 + 8;
      if (((uint)RVar16 & 2) != 0) {
        __assert_fail("pRef->fVisit == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absGlaOld.c"
                      ,599,"Vec_Int_t *Gla_ManRefinement2(Gla_Man_t *)");
      }
    }
    for (iVar18 = 0; iVar18 < vRoAnds->nSize; iVar18 = iVar18 + 1) {
      pGVar2 = p->pGia;
      uVar6 = Vec_IntEntry(vRoAnds,iVar18);
      pVVar13 = (Vec_Int_t *)(ulong)uVar6;
      pObj = (Vec_Int_t *)Gia_ManObj(pGVar2,uVar6);
      if (pObj == (Vec_Int_t *)0x0) break;
      if (pObj->nCap < 0 || (~pObj->nCap & 0x1fffffffU) == 0) {
        iVar17 = Gia_ObjIsRo(p->pGia,(Gia_Obj_t *)pObj);
        if (iVar17 == 0) {
          __assert_fail("Gia_ObjIsAnd(pObj) || Gia_ObjIsRo(p->pGia, pObj)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absGlaOld.c"
                        ,0x25c,"Vec_Int_t *Gla_ManRefinement2(Gla_Man_t *)");
        }
      }
      pRVar9 = Gla_ObjRef(p,(Gia_Obj_t *)pObj,iVar19);
      *pRVar9 = (Rfn_Obj_t)0x0;
      pVVar13 = pObj;
      iVar17 = Gia_ObjIsRo(p->pGia,(Gia_Obj_t *)pObj);
      if (iVar17 == 0) {
        uVar1 = pObj->nCap;
        if (((int)uVar1 < 0) || ((uVar1 & 0x1fffffff) == 0x1fffffff)) {
          __assert_fail("Gia_ObjIsAnd(pObj)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absGlaOld.c"
                        ,0x26f,"Vec_Int_t *Gla_ManRefinement2(Gla_Man_t *)");
        }
        pRVar11 = Gla_ObjRef(p,(Gia_Obj_t *)((ulong)(uVar1 & 0x1fffffff) * -0xc + (long)pObj),iVar19
                            );
        pRVar12 = Gla_ObjRef(p,(Gia_Obj_t *)((ulong)(pObj->nSize & 0x1fffffff) * -0xc + (long)pObj),
                             iVar19);
        uVar3._0_4_ = pObj->nCap;
        uVar3._4_4_ = pObj->nSize;
        *pRVar9 = (Rfn_Obj_t)
                  ((uint)*pRVar9 & 0xfffffffe |
                  ((uint)uVar3._4_4_ >> 0x1d ^ (uint)*pRVar12) &
                  ((uint)(uVar3 >> 0x1d) & 7 ^ (uint)*pRVar11) & 1);
        puVar4 = p->pObj2Obj;
        iVar17 = Gia_ObjId(p->pGia,(Gia_Obj_t *)pObj);
        if (puVar4[iVar17] != 0xffffffff) {
          puVar4 = p->pObj2Obj;
          iVar17 = Gia_ObjId(p->pGia,(Gia_Obj_t *)pObj);
          iVar17 = Gla_ManCheckVar(p,puVar4[iVar17],iVar19);
          if (iVar17 != 0) {
            RVar16 = *pRVar9;
            iVar17 = Gia_ObjId(p->pGia,(Gia_Obj_t *)pObj);
            pGVar21 = p;
            uVar6 = Gla_ObjSatValue(p,iVar17,iVar19);
            if (((uint)RVar16 & 1) != uVar6) {
              Abc_Print((int)pGVar21,"Object has value mismatch    ");
              Gia_ObjPrint(p->pGia,(Gia_Obj_t *)pObj);
            }
          }
        }
        RVar16 = *pRVar9;
        RVar20 = *pRVar11;
        if (((uint)RVar16 & 1) == 0) {
          uVar5._0_4_ = pObj->nCap;
          uVar5._4_4_ = pObj->nSize;
          RVar15 = *pRVar12;
          if ((((uint)(uVar5 >> 0x1d) & 7 ^ (uint)RVar20) & 1) == 0) {
            if ((((uint)uVar5._4_4_ >> 0x1d ^ (uint)RVar15) & 1) != 0) {
              uVar6 = (uint)RVar20 & 0x7fff8;
              pVVar13 = (Vec_Int_t *)(ulong)uVar6;
              uVar8 = 0xfff80006;
              goto LAB_004a11d9;
            }
            RVar20 = (Rfn_Obj_t)((uint)RVar20 >> 3 & 0xffff);
            RVar15 = (Rfn_Obj_t)((uint)RVar15 >> 3 & 0xffff);
            if ((uint)RVar20 < (uint)RVar15) {
              RVar15 = RVar20;
            }
            uVar6 = (int)RVar15 << 3;
          }
          else {
            uVar6 = (uint)RVar15 & 0x7fff8;
          }
          pVVar13 = (Vec_Int_t *)(ulong)(uint)RVar20;
          uVar8 = 0xfff80006;
        }
        else {
          uVar8 = (uint)RVar20 >> 3 & 0xffff;
          pVVar13 = (Vec_Int_t *)(ulong)uVar8;
          uVar6 = (uint)*pRVar12 >> 3 & 0xffff;
          if (uVar6 < uVar8) {
            uVar6 = uVar8;
          }
          uVar6 = uVar6 << 3;
          uVar8 = 0xfff80007;
        }
LAB_004a11d9:
        *pRVar9 = (Rfn_Obj_t)(uVar8 & (uint)RVar16 | uVar6);
        if (((uint)RVar16 & 2) != 0) {
          __assert_fail("pRef->fVisit == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absGlaOld.c"
                        ,0x284,"Vec_Int_t *Gla_ManRefinement2(Gla_Man_t *)");
        }
        uVar6 = uVar8 & (uint)RVar16 & 0x8007fffd | uVar6;
LAB_004a11fd:
        RVar16 = (Rfn_Obj_t)(uVar6 | (Gla_ManRefinement2::Sign & 0xfffU) << 0x13);
      }
      else {
        if (iVar19 == 0) {
          uVar6 = (uint)*pRVar9 & 0x80000006;
          goto LAB_004a11fd;
        }
        pGVar10 = Gia_ObjRoToRi(p->pGia,(Gia_Obj_t *)pObj);
        pRVar11 = Gla_ObjRef(p,pGVar10,iVar19 + -1);
        RVar16 = *pRVar11;
        RVar20 = *pRVar9;
        *pRVar9 = (Rfn_Obj_t)((uint)RVar20 & 0xfffffffe | (uint)RVar16 & 1);
        uVar6 = (uint)RVar20 & 0x80000006 | (uint)RVar16 & 1 | (uint)*pRVar11 & 0x7fff8;
        pVVar13 = (Vec_Int_t *)(ulong)uVar6;
        RVar16 = (Rfn_Obj_t)((Gla_ManRefinement2::Sign & 0xfffU) << 0x13 | uVar6);
      }
      *pRVar9 = RVar16;
    }
    iVar18 = vCos->nSize;
    iVar17 = 0;
    if (iVar18 < 1) {
      iVar18 = 0;
      iVar17 = 0;
    }
    for (; iVar18 != iVar17; iVar17 = iVar17 + 1) {
      pGVar2 = p->pGia;
      uVar6 = Vec_IntEntry(vCos,iVar17);
      pVVar13 = (Vec_Int_t *)(ulong)uVar6;
      pGVar10 = Gia_ManObj(pGVar2,uVar6);
      if (pGVar10 == (Gia_Obj_t *)0x0) break;
      pRVar9 = Gla_ObjRef(p,pGVar10,iVar19);
      *pRVar9 = (Rfn_Obj_t)0x0;
      pRVar11 = Gla_ObjRef(p,pGVar10 + -(ulong)((uint)*(undefined8 *)pGVar10 & 0x1fffffff),iVar19);
      RVar16 = *pRVar9;
      pVVar13 = (Vec_Int_t *)(ulong)(uint)RVar16;
      uVar6 = (*(uint *)pGVar10 >> 0x1d ^ (uint)*pRVar11) & 1;
      *pRVar9 = (Rfn_Obj_t)((uint)RVar16 & 0xfffffffe | uVar6);
      RVar20 = *pRVar11;
      *pRVar9 = (Rfn_Obj_t)((uint)RVar16 & 0xfff80006 | uVar6 | (uint)RVar20 & 0x7fff8);
      if (((uint)RVar16 & 2) != 0) {
        __assert_fail("pRef->fVisit == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absGlaOld.c"
                      ,0x28e,"Vec_Int_t *Gla_ManRefinement2(Gla_Man_t *)");
      }
      *pRVar9 = (Rfn_Obj_t)
                ((uint)RVar16 & 0x80000004 | uVar6 | (uint)RVar20 & 0x7fff8 |
                (Gla_ManRefinement2::Sign & 0xfffU) << 0x13);
    }
  }
  pGVar10 = Gia_ManPo(p->pGia,(int)pVVar13);
  pGVar21 = p;
  pRVar9 = Gla_ObjRef(p,pGVar10,p->pPars->iFrame);
  RVar16 = *pRVar9;
  if (((uint)RVar16 & 1) == 0) {
    Abc_Print((int)pGVar21,"\nCounter-example verification has failed!!!\n");
    RVar16 = *pRVar9;
  }
  if (((uint)RVar16 & 0x7fff8) == 0) {
    pAVar14 = Gla_ManDeriveCex(p,vPis);
    p->pGia->pCexSeq = pAVar14;
    Vec_IntFree(vPis);
    Vec_IntFree(vPPis);
    Vec_IntFree(vRoAnds);
    Vec_IntFree(vCos);
    pVVar13 = (Vec_Int_t *)0x0;
  }
  else {
    pVVar13 = Vec_IntAlloc(100);
    iVar19 = p->pPars->iFrame + 1;
    Vec_IntFill(p->vObjCounts,iVar19,0);
    pGVar10 = Gia_ManPo(p->pGia,iVar19);
    Gla_ManRefSelect_rec
              (p,pGVar10 + -(ulong)((uint)*(undefined8 *)pGVar10 & 0x1fffffff),p->pPars->iFrame,
               pVVar13,Gla_ManRefinement2::Sign);
    Vec_IntUniqify(pVVar13);
    Gla_ManVerifyUsingTerSim(p,vPis,vPPis,vRoAnds,vCos,pVVar13);
    for (iVar19 = 0; iVar19 < pVVar13->nSize; iVar19 = iVar19 + 1) {
      pGVar2 = p->pGia;
      iVar18 = Vec_IntEntry(pVVar13,iVar19);
      pGVar10 = Gia_ManObj(pGVar2,iVar18);
      if (pGVar10 == (Gia_Obj_t *)0x0) break;
      puVar4 = p->pObj2Obj;
      iVar18 = Gia_ObjId(p->pGia,pGVar10);
      Vec_IntWriteEntry(pVVar13,iVar19,puVar4[iVar18]);
    }
    Vec_IntFree(vPis);
    Vec_IntFree(vPPis);
    Vec_IntFree(vRoAnds);
    Vec_IntFree(vCos);
    p->nObjAdded = p->nObjAdded + pVVar13->nSize;
  }
  return pVVar13;
}

Assistant:

Vec_Int_t * Gla_ManRefinement2( Gla_Man_t * p )
{
    int fVerify = 1;
    static int Sign = 0;
    Vec_Int_t * vPis, * vPPis, * vCos, * vRoAnds, * vSelect = NULL;
    Rfn_Obj_t * pRef, * pRef0, * pRef1;
    Gia_Obj_t * pObj;
    int i, f;
    Sign++;

    // compute PIs and pseudo-PIs
    vCos = Vec_IntAlloc( 1000 );
    vPis = Vec_IntAlloc( 1000 );  
    vPPis = Vec_IntAlloc( 1000 );
    vRoAnds = Vec_IntAlloc( 1000 );  
    Gla_ManCollect( p, vPis, vPPis, vCos, vRoAnds );

/*
    // check how many pseudo PIs have variables
    Gla_ManForEachObjAbsVec( vPis, p, pGla, i )
    {
        Abc_Print( 1, "  %5d : ", Gla_ObjId(p, pGla) );
        for ( f = 0; f <= p->pPars->iFrame; f++ )
            Abc_Print( 1, "%d", Gla_ManCheckVar(p, Gla_ObjId(p, pGla), f) );
        Abc_Print( 1, "\n" );
    }    

    // check how many pseudo PIs have variables
    Gla_ManForEachObjAbsVec( vPPis, p, pGla, i )
    {
        Abc_Print( 1, "%5d : ", Gla_ObjId(p, pGla) );
        for ( f = 0; f <= p->pPars->iFrame; f++ )
            Abc_Print( 1, "%d", Gla_ManCheckVar(p, Gla_ObjId(p, pGla), f) );
        Abc_Print( 1, "\n" );
    }    
*/
    // propagate values
    for ( f = 0; f <= p->pPars->iFrame; f++ )
    {
        // constant
        pRef = Gla_ObjRef( p, Gia_ManConst0(p->pGia), f );  Gla_ObjClearRef( pRef );
        pRef->Value  = 0;
        pRef->Prio   = 0;
        pRef->Sign   = Sign;
        // primary input
        Gia_ManForEachObjVec( vPis, p->pGia, pObj, i )
        {
//            assert( f == p->pPars->iFrame || Gla_ManCheckVar(p, p->pObj2Obj[Gia_ObjId(p->pGia, pObj)], f) );
            pRef = Gla_ObjRef( p, pObj, f );   Gla_ObjClearRef( pRef );
            pRef->Value = Gla_ObjSatValue( p, Gia_ObjId(p->pGia, pObj), f );
            pRef->Prio  = 0;
            pRef->Sign  = Sign;
            assert( pRef->fVisit == 0 );
        }
        // primary input
        Gia_ManForEachObjVec( vPPis, p->pGia, pObj, i )
        {
//            assert( f == p->pPars->iFrame || Gla_ManCheckVar(p, p->pObj2Obj[Gia_ObjId(p->pGia, pObj)], f) );
            assert( Gia_ObjIsAnd(pObj) || Gia_ObjIsRo(p->pGia, pObj) );
            pRef = Gla_ObjRef( p, pObj, f );   Gla_ObjClearRef( pRef );
            pRef->Value = Gla_ObjSatValue( p, Gia_ObjId(p->pGia, pObj), f );
            pRef->Prio  = i+1;
            pRef->fPPi  = 1;
            pRef->Sign  = Sign;
            assert( pRef->fVisit == 0 );
        }
        // internal nodes
        Gia_ManForEachObjVec( vRoAnds, p->pGia, pObj, i )
        {
            assert( Gia_ObjIsAnd(pObj) || Gia_ObjIsRo(p->pGia, pObj) );
            pRef = Gla_ObjRef( p, pObj, f );   Gla_ObjClearRef( pRef );
            if ( Gia_ObjIsRo(p->pGia, pObj) )
            {
                if ( f == 0 )
                {
                    pRef->Value = 0;
                    pRef->Prio  = 0;
                    pRef->Sign  = Sign;
                }
                else
                {
                    pRef0 = Gla_ObjRef( p, Gia_ObjRoToRi(p->pGia, pObj), f-1 );
                    pRef->Value = pRef0->Value;
                    pRef->Prio  = pRef0->Prio;
                    pRef->Sign  = Sign;
                }
                continue;
            }
            assert( Gia_ObjIsAnd(pObj) );
            pRef0 = Gla_ObjRef( p, Gia_ObjFanin0(pObj), f );
            pRef1 = Gla_ObjRef( p, Gia_ObjFanin1(pObj), f );
            pRef->Value = (pRef0->Value ^ Gia_ObjFaninC0(pObj)) & (pRef1->Value ^ Gia_ObjFaninC1(pObj));

            if ( p->pObj2Obj[Gia_ObjId(p->pGia, pObj)] != ~0 && 
                 Gla_ManCheckVar(p, p->pObj2Obj[Gia_ObjId(p->pGia, pObj)], f) &&
                 (int)pRef->Value != Gla_ObjSatValue(p, Gia_ObjId(p->pGia, pObj), f) )
            {
                    Abc_Print( 1, "Object has value mismatch    " );
                    Gia_ObjPrint( p->pGia, pObj );
            }

            if ( pRef->Value == 1 )
                pRef->Prio  = Abc_MaxInt( pRef0->Prio, pRef1->Prio );
            else if ( (pRef0->Value ^ Gia_ObjFaninC0(pObj)) == 0 && (pRef1->Value ^ Gia_ObjFaninC1(pObj)) == 0 )
                pRef->Prio  = Abc_MinInt( pRef0->Prio, pRef1->Prio ); // choice
            else if ( (pRef0->Value ^ Gia_ObjFaninC0(pObj)) == 0 )
                pRef->Prio  = pRef0->Prio;
            else 
                pRef->Prio  = pRef1->Prio;
            assert( pRef->fVisit == 0 );
            pRef->Sign  = Sign;
        }
        // output nodes
        Gia_ManForEachObjVec( vCos, p->pGia, pObj, i )
        {
            pRef = Gla_ObjRef( p, pObj, f );    Gla_ObjClearRef( pRef );
            pRef0 = Gla_ObjRef( p, Gia_ObjFanin0(pObj), f ); 
            pRef->Value = (pRef0->Value ^ Gia_ObjFaninC0(pObj));
            pRef->Prio  = pRef0->Prio;
            assert( pRef->fVisit == 0 );
            pRef->Sign  = Sign;
        }
    } 

    // make sure the output value is 1
    pObj = Gia_ManPo( p->pGia, 0 );
    pRef = Gla_ObjRef( p, pObj, p->pPars->iFrame );
    if ( pRef->Value != 1 )
        Abc_Print( 1, "\nCounter-example verification has failed!!!\n" );

    // check the CEX
    if ( pRef->Prio == 0 )
    {
        p->pGia->pCexSeq = Gla_ManDeriveCex( p, vPis );
        Vec_IntFree( vPis );
        Vec_IntFree( vPPis );
        Vec_IntFree( vRoAnds );
        Vec_IntFree( vCos );
        return NULL;
    }

    // select objects
    vSelect = Vec_IntAlloc( 100 );
    Vec_IntFill( p->vObjCounts, p->pPars->iFrame+1, 0 );
    Gla_ManRefSelect_rec( p, Gia_ObjFanin0(Gia_ManPo(p->pGia, 0)), p->pPars->iFrame, vSelect, Sign );
    Vec_IntUniqify( vSelect );

/*
    for ( f = 0; f < p->pPars->iFrame; f++ )
        printf( "%2d", Vec_IntEntry(p->vObjCounts, f) );
    printf( "\n" );
*/
    if ( fVerify )
        Gla_ManVerifyUsingTerSim( p, vPis, vPPis, vRoAnds, vCos, vSelect );

    // remap them into GLA objects
    Gia_ManForEachObjVec( vSelect, p->pGia, pObj, i )
        Vec_IntWriteEntry( vSelect, i, p->pObj2Obj[Gia_ObjId(p->pGia, pObj)] );

    Vec_IntFree( vPis );
    Vec_IntFree( vPPis );
    Vec_IntFree( vRoAnds );
    Vec_IntFree( vCos );

    p->nObjAdded += Vec_IntSize(vSelect);
    return vSelect;
}